

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fastprojectile.cpp
# Opt level: O2

void __thiscall AFastProjectile::Effect(AFastProjectile *this)

{
  TObjPtr<AActor> *obj;
  double dVar1;
  _func_void_void_ptr *p_Var2;
  PClass *pPVar3;
  PClassActor *type;
  AActor *pAVar4;
  AActor *pAVar5;
  double dVar6;
  FName local_3c;
  DVector3 local_38;
  
  pPVar3 = DObject::GetClass((DObject *)this);
  local_3c.Index = *(int *)&pPVar3[1].field_0xd4;
  if (local_3c.Index == 0) {
    return;
  }
  dVar1 = (this->super_AActor).__Pos.Z;
  dVar6 = (this->super_AActor).floorz;
  pPVar3 = DObject::GetClass((DObject *)this);
  p_Var2 = pPVar3[1].ConstructNative;
  type = PClass::FindActor(&local_3c);
  if (type == (PClassActor *)0x0) {
    return;
  }
  dVar1 = dVar1 + -8.0;
  if (dVar6 <= dVar1) {
    dVar6 = dVar1;
  }
  local_38.Z = dVar6 + (double)p_Var2;
  local_38.X = (this->super_AActor).__Pos.X;
  local_38.Y = (this->super_AActor).__Pos.Y;
  pAVar4 = Spawn(type,&local_38,ALLOW_REPLACE);
  if (pAVar4 == (AActor *)0x0) {
    return;
  }
  if (((this->super_AActor).flags5.Value & 2) != 0) {
    obj = &(this->super_AActor).target;
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar5 != (AActor *)0x0) {
      (pAVar4->target).field_0.p = (AActor *)obj->field_0;
      goto LAB_0055e4cc;
    }
  }
  (pAVar4->target).field_0.p = &this->super_AActor;
LAB_0055e4cc:
  (pAVar4->Angles).Pitch.Degrees = (this->super_AActor).Angles.Pitch.Degrees;
  (pAVar4->Angles).Yaw.Degrees = (this->super_AActor).Angles.Yaw.Degrees;
  return;
}

Assistant:

void AFastProjectile::Effect()
{
	FName name = GetClass()->MissileName;
	if (name != NAME_None)
	{
		double hitz = Z()-8;

		if (hitz < floorz)
		{
			hitz = floorz;
		}
		// Do not clip this offset to the floor.
		hitz += GetClass()->MissileHeight;
		
		PClassActor *trail = PClass::FindActor(name);
		if (trail != NULL)
		{
			AActor *act = Spawn (trail, PosAtZ(hitz), ALLOW_REPLACE);
			if (act != nullptr)
			{
				if ((flags5 & MF5_GETOWNER) && (target != nullptr))
					act->target = target;
				else
					act->target = this;
				
				act->Angles.Pitch = Angles.Pitch;
				act->Angles.Yaw = Angles.Yaw;
			}
		}
	}
}